

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_checkCParams(ZSTD_compressionParameters cParams)

{
  int iVar1;
  int in_stack_00000008;
  int in_stack_0000000c;
  undefined8 local_10;
  
  iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_windowLog,in_stack_00000008);
  if (iVar1 == 0) {
    local_10 = 0xffffffffffffffd6;
  }
  else {
    iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_chainLog,in_stack_0000000c);
    if (iVar1 == 0) {
      local_10 = 0xffffffffffffffd6;
    }
    else {
      iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_hashLog,cParams.windowLog);
      if (iVar1 == 0) {
        local_10 = 0xffffffffffffffd6;
      }
      else {
        iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_searchLog,cParams.chainLog);
        if (iVar1 == 0) {
          local_10 = 0xffffffffffffffd6;
        }
        else {
          iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_minMatch,cParams.hashLog);
          if (iVar1 == 0) {
            local_10 = 0xffffffffffffffd6;
          }
          else {
            iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_targetLength,cParams.searchLog);
            if (iVar1 == 0) {
              local_10 = 0xffffffffffffffd6;
            }
            else {
              iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_strategy,cParams.minMatch);
              if (iVar1 == 0) {
                local_10 = 0xffffffffffffffd6;
              }
              else {
                local_10 = 0;
              }
            }
          }
        }
      }
    }
  }
  return local_10;
}

Assistant:

size_t ZSTD_checkCParams(ZSTD_compressionParameters cParams)
{
    BOUNDCHECK(ZSTD_c_windowLog, (int)cParams.windowLog);
    BOUNDCHECK(ZSTD_c_chainLog,  (int)cParams.chainLog);
    BOUNDCHECK(ZSTD_c_hashLog,   (int)cParams.hashLog);
    BOUNDCHECK(ZSTD_c_searchLog, (int)cParams.searchLog);
    BOUNDCHECK(ZSTD_c_minMatch,  (int)cParams.minMatch);
    BOUNDCHECK(ZSTD_c_targetLength,(int)cParams.targetLength);
    BOUNDCHECK(ZSTD_c_strategy,  cParams.strategy);
    return 0;
}